

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

void __thiscall
Importer_rangeOfValidSituations_Test::~Importer_rangeOfValidSituations_Test
          (Importer_rangeOfValidSituations_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, rangeOfValidSituations)
{
    // This is a test to figure out whether we need to restrict the library keys to absolute URLs, or
    // whether they could be any string.  This test creates a collection of models from different sources,
    // some which need imports, some not, and uses them to resolve imports on another model.
    auto parser = libcellml::Parser::create();

    // Parsing concrete units and components.
    auto concreteUnits = parser->parseModel(fileContents("importer/units_concrete.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    auto concreteComponents = parser->parseModel(fileContents("importer/components_concrete.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    // Parsing a model which imports components and units from files called units_source.cellml
    // and components_source.cellml respectively.  These "hidden" files will also be added to the importer
    // library when they're resolved.
    auto importedUnits = parser->parseModel(fileContents("importer/units_imported.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    auto importedComponents = parser->parseModel(fileContents("importer/components_imported.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    // Create models through the API. These don't need import resolution.
    auto localConcreteUnits = libcellml::Model::create("localConcreteUnits");
    localConcreteUnits->addUnits(libcellml::Units::create("units5"));

    // Add all the concrete models to the Importer. These don't need resolving as they have no imports of their own.
    auto importer = libcellml::Importer::create();
    importer->addModel(concreteUnits, "i_dont_exist_yet.cellml"); // add with key that's not a file (yet).
    importer->addModel(concreteComponents, "https://www.example.com/myComponents.cellml"); // add with a key that is a remote URL.

    // Add models which have imports to the Importer by resolving them. They are automatically saved into the
    // Importer's library, along with any dependencies, under the names used to resolve them.
    importer->resolveImports(importedUnits, resourcePath("importer/"));
    importer->resolveImports(importedComponents, resourcePath("importer/"));

    EXPECT_FALSE(importedUnits->hasUnresolvedImports());
    EXPECT_FALSE(importedComponents->hasUnresolvedImports());

    // Now create a funky model that imports from all over the place and see what happens.
    const std::string funkyString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"funky\">\n"
        // Status quo functionality, key is relative URL + base file path as the relative URL doesn't exist as a key.
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"units_imported.cellml\">\n"
        "    <units units_ref=\"units1_imported\" name=\"units1FromLibrary\"/>\n"
        "  </import>\n"
        // Use the relative URL for a hidden child source component.
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"components_source.cellml\">\n"
        "    <component component_ref=\"component1\" name=\"component1FromLibrary\"/>\n"
        "  </import>\n"
        // Use the absolute URL for a hidden child source component.
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\""
        + resourcePath("importer/components_source.cellml")
        + "\">\n"
          "    <component component_ref=\"component2\" name=\"component2FromLibrary\"/>\n"
          "  </import>\n"
          // Remote website URL used for key.
          "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"https://www.example.com/myComponents.cellml\">\n"
          "    <component component_ref=\"component3\" name=\"component3FromLibrary\"/>\n"
          "  </import>\n"
          // Currently non-existent file used for the key. For this CellML file to function outside of the
          // the Importer instance, this model needs to be written to this location.
          "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"i_dont_exist_yet.cellml\">\n"
          "    <units units_ref=\"units4\" name=\"units4FromLibrary\"/>\n"
          "  </import>\n"
          "</model>";

    auto funkyModel = parser->parseModel(funkyString);
    EXPECT_EQ(size_t(0), parser->issueCount());

    // Pass in a base file path, this will be used to resolve URLs if they don't already exist as keys.
    // This allows the model to be resolved against different locations where local files are specified.
    importer->resolveImports(funkyModel, resourcePath("importer/"));
    EXPECT_FALSE(funkyModel->hasUnresolvedImports());
    EXPECT_EQ(size_t(0), importer->issueCount());

    // Funky hrefs are valid ...
    auto validator = libcellml::Validator::create();
    validator->validateModel(funkyModel);
    EXPECT_EQ(size_t(0), validator->issueCount());

    // ... and can be flattened as expected too.
    auto flattenedFunkyModel = importer->flattenModel(funkyModel);
    EXPECT_EQ(size_t(0), importer->issueCount());

    flattenedFunkyModel->setName("flattenedFunkyModel");
    validator->validateModel(flattenedFunkyModel);
    EXPECT_EQ(size_t(0), validator->issueCount());
}